

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

char get_and_check(Translation_Data *translation_data,KEYWORDS kw)

{
  Queue *q;
  void *__ptr;
  
  q = translation_data->tokens;
  if ((q->size != 0) && (*q->first->data == kw)) {
    __ptr = Queue_Pop(q);
    free(__ptr);
    return '\x01';
  }
  return '\0';
}

Assistant:

char get_and_check(struct Translation_Data *translation_data,enum KEYWORDS kw)
{
	struct token *hold_token;
	if(translation_data->tokens->size==0)
	{
		return 0;
	}else
	{
		hold_token=translation_data->tokens->first->data;
		if(hold_token->type!=kw)
		{
			return 0;
		}else
		{
			hold_token=Queue_Pop(translation_data->tokens);
			free(hold_token);
			return 1;
		}
	}
}